

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_dxt_hc.cpp
# Opt level: O1

void __thiscall
crnlib::dxt_hc::create_alpha_selector_codebook_task(dxt_hc *this,uint64 data,void *pData_ptr)

{
  byte bVar1;
  ushort uVar2;
  uint uVar3;
  alpha_cluster *paVar4;
  color_quad_u8 (*pacVar5) [16];
  ulong uVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  int *piVar9;
  ulong uVar10;
  int *piVar11;
  int iVar12;
  uint uVar13;
  uint uVar14;
  uint p_1;
  ulong uVar15;
  long lVar16;
  long lVar17;
  uint s_2;
  uint uVar18;
  long lVar19;
  ulong uVar20;
  uint s;
  long lVar21;
  ulong uVar22;
  uint uVar23;
  uint E6 [8] [64];
  ulong local_a50;
  int local_a38 [128];
  int local_838 [64];
  int aiStack_738 [64];
  int aiStack_638 [64];
  int aiStack_538 [64];
  int aiStack_438 [64];
  int aiStack_338 [64];
  int aiStack_238 [64];
  int aiStack_138 [66];
  
  uVar15 = CONCAT44(0,this->m_pTask_pool->m_num_threads + 1);
  uVar20 = (ulong)(this->m_num_blocks >> (this->m_has_subblocks & 0x1fU));
  auVar7._8_8_ = 0;
  auVar7._0_8_ = uVar15;
  auVar8._8_8_ = 0;
  auVar8._0_8_ = uVar20 * data;
  uVar15 = ((data + 1) * uVar20) / uVar15;
  if (SUB164(auVar8 / auVar7,0) < (uint)uVar15) {
    local_a50 = SUB168(auVar8 / auVar7,0) & 0xffffffff;
    do {
      if (this->m_num_alpha_blocks - 1 < 0xfffffffe) {
        uVar20 = 1;
        do {
          piVar9 = local_a38;
          uVar3 = (this->m_params).m_alpha_component_indices[uVar20 - 1];
          uVar23 = (int)local_a50 << (this->m_has_subblocks & 0x1fU);
          uVar2 = (this->m_endpoint_indices).m_p[uVar23].field_0.component[uVar20];
          paVar4 = (this->m_alpha_clusters).m_p;
          pacVar5 = this->m_blocks;
          lVar16 = 0;
          do {
            bVar1 = pacVar5[local_a50][lVar16].field_0.c[uVar3];
            lVar21 = 0;
            do {
              iVar12 = (uint)bVar1 -
                       *(int *)((long)paVar4->alpha_values +
                               lVar21 * 4 + (ulong)((uint)uVar2 * 0x90));
              piVar9[lVar21] = iVar12 * iVar12;
              lVar21 = lVar21 + 1;
            } while (lVar21 != 8);
            lVar16 = lVar16 + 1;
            piVar9 = piVar9 + 8;
          } while (lVar16 != 0x10);
          piVar9 = local_838;
          lVar16 = 0;
          do {
            uVar22 = 0;
            do {
              piVar9[uVar22] =
                   local_a38[(lVar16 * 2 + 1) * 8 + (uVar22 >> 3 & 0x1fffffff)] +
                   local_a38[lVar16 * 0x10 + (ulong)((uint)uVar22 & 7)];
              uVar22 = uVar22 + 1;
            } while (uVar22 != 0x40);
            lVar16 = lVar16 + 1;
            piVar9 = piVar9 + 0x40;
          } while (lVar16 != 8);
          uVar22 = (ulong)(this->m_alpha_selectors).m_size;
          if (uVar22 == 0) {
            uVar13 = 0;
          }
          else {
            uVar10 = 0;
            uVar18 = 0xffffffff;
            uVar13 = 0;
            do {
              uVar6 = (this->m_alpha_selectors).m_p[uVar10];
              uVar14 = (uint)(uVar6 >> 0x20);
              uVar14 = *(int *)((long)aiStack_738 + (ulong)((uint)(uVar6 >> 4) & 0xfc)) +
                       local_838[(uint)uVar6 & 0x3f] +
                       *(int *)((long)aiStack_638 + (ulong)((uint)(uVar6 >> 10) & 0xfc)) +
                       *(int *)((long)aiStack_538 + (ulong)((uint)(uVar6 >> 0x10) & 0xfc)) +
                       *(int *)((long)aiStack_438 + (ulong)((uint)(uVar6 >> 0x16) & 0xfc)) +
                       aiStack_338[(uint)(uVar6 >> 0x1e) & 0x3f] + aiStack_238[uVar14 >> 4 & 0x3f] +
                       aiStack_138[uVar14 >> 10 & 0x3f];
              if (uVar14 < uVar18) {
                uVar18 = uVar14;
                uVar13 = (uint)uVar10;
              }
              uVar10 = uVar10 + 1;
            } while (uVar22 != uVar10);
          }
          piVar9 = local_a38;
          if (*(char *)((long)paVar4->refined_alpha_values + ((ulong)((uint)uVar2 * 0x90) - 4)) !=
              '\0') {
            pacVar5 = this->m_blocks;
            lVar16 = 0;
            piVar11 = piVar9;
            do {
              bVar1 = pacVar5[local_a50][lVar16].field_0.c[uVar3];
              lVar21 = 0;
              do {
                iVar12 = (uint)bVar1 -
                         *(int *)((long)paVar4->refined_alpha_values +
                                 lVar21 * 4 + (ulong)((uint)uVar2 * 0x90));
                piVar11[lVar21] = iVar12 * iVar12;
                lVar21 = lVar21 + 1;
              } while (lVar21 != 8);
              lVar16 = lVar16 + 1;
              piVar11 = piVar11 + 8;
            } while (lVar16 != 0x10);
          }
          lVar21 = (ulong)uVar13 * 0x204 + *pData_ptr;
          lVar17 = 0;
          lVar16 = lVar21;
          do {
            lVar19 = 0;
            do {
              piVar11 = (int *)(lVar16 + lVar19 * 4);
              *piVar11 = *piVar11 + piVar9[lVar19];
              lVar19 = lVar19 + 1;
            } while (lVar19 != 8);
            lVar17 = lVar17 + 1;
            piVar9 = piVar9 + 8;
            lVar16 = lVar16 + 0x20;
          } while (lVar17 != 0x10);
          *(undefined1 *)(lVar21 + 0x200) = 1;
          (this->m_selector_indices).m_p[uVar23].field_0.component[uVar20] = (uint16)uVar13;
          uVar20 = uVar20 + 1;
        } while (uVar20 < this->m_num_alpha_blocks + 1);
      }
      local_a50 = local_a50 + 1;
    } while (local_a50 < (uVar15 & 0xffffffff));
  }
  return;
}

Assistant:

void dxt_hc::create_alpha_selector_codebook_task(uint64 data, void* pData_ptr)
    {
        crnlib::vector<alpha_selector_details>& selector_details = *static_cast<crnlib::vector<alpha_selector_details>*>(pData_ptr);
        uint num_tasks = m_pTask_pool->get_num_threads() + 1;
        uint E3[16][8];
        uint E6[8][64];
        for (uint n = m_has_subblocks ? m_num_blocks >> 1 : m_num_blocks, b = n * data / num_tasks, bEnd = n * (data + 1) / num_tasks; b < bEnd; b++)
        {
            for (uint c = cAlpha0; c < cAlpha0 + m_num_alpha_blocks; c++)
            {
                const uint alpha_pixel_comp = m_params.m_alpha_component_indices[c - cAlpha0];
                alpha_cluster& cluster = m_alpha_clusters[m_endpoint_indices[m_has_subblocks ? b << 1 : b].component[c]];
                uint* block_values = cluster.alpha_values;
                for (uint p = 0; p < 16; p++)
                {
                    for (uint s = 0; s < 8; s++)
                    {
                        int delta = m_blocks[b][p][alpha_pixel_comp] - block_values[s];
                        E3[p][s] = delta * delta;
                    }
                }
                for (uint p = 0; p < 8; p++)
                {
                    for (uint s = 0; s < 64; s++)
                    {
                        E6[p][s] = E3[p << 1][s & 7] + E3[p << 1 | 1][s >> 3];
                    }
                }
                uint best_index = 0;
                for (uint best_error = cUINT32_MAX, s = 0; s < m_alpha_selectors.size(); s++)
                {
                    uint64 selector = m_alpha_selectors[s];
                    uint error = E6[0][selector & 63];
                    error += E6[1][selector >> 6 & 63];
                    error += E6[2][selector >> 12 & 63];
                    error += E6[3][selector >> 18 & 63];
                    error += E6[4][selector >> 24 & 63];
                    error += E6[5][selector >> 30 & 63];
                    error += E6[6][selector >> 36 & 63];
                    error += E6[7][selector >> 42 & 63];
                    if (error < best_error)
                    {
                        best_error = error;
                        best_index = s;
                    }
                }
                if (cluster.refined_alpha)
                {
                    block_values = cluster.refined_alpha_values;
                    for (uint p = 0; p < 16; p++)
                    {
                        for (uint s = 0; s < 8; s++)
                        {
                            int delta = m_blocks[b][p][alpha_pixel_comp] - block_values[s];
                            E3[p][s] = delta * delta;
                        }
                    }
                }
                uint(&total_errors)[16][8] = selector_details[best_index].error;
                for (uint p = 0; p < 16; p++)
                {
                    for (uint s = 0; s < 8; s++)
                    {
                        total_errors[p][s] += E3[p][s];
                    }
                }
                selector_details[best_index].used = true;
                m_selector_indices[m_has_subblocks ? b << 1 : b].component[c] = best_index;
            }
        }
    }